

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint readChunk_zTXt(LodePNGInfo *info,LodePNGDecompressSettings *zlibsettings,uchar *data,
                   size_t chunkLength)

{
  char *key;
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  ucvector decoded;
  
  decoded.data = (uchar *)0x0;
  decoded.size = 0;
  decoded.allocsize = 0;
  uVar2 = 2;
  while ((uVar3 = (ulong)(uVar2 - 2), uVar3 < chunkLength && (data[uVar3] != '\0'))) {
    uVar2 = uVar2 + 1;
  }
  if (uVar2 < chunkLength) {
    if (uVar2 - 0x52 < 0xffffffb1) {
      uVar2 = 0x59;
    }
    else {
      key = (char *)malloc((ulong)(uVar2 - 1));
      if (key != (char *)0x0) {
        key[uVar3] = '\0';
        for (uVar1 = 0; uVar3 != uVar1; uVar1 = uVar1 + 1) {
          key[uVar1] = data[uVar1];
        }
        if (data[uVar2 - 1] == '\0') {
          uVar2 = zlib_decompress(&decoded.data,&decoded.size,data + uVar2,
                                  (ulong)((int)chunkLength - uVar2),zlibsettings);
          if (uVar2 == 0) {
            ucvector_push_back(&decoded,'\0');
            uVar2 = lodepng_add_text(info,key,(char *)decoded.data);
          }
        }
        else {
          uVar2 = 0x48;
        }
        goto LAB_00108471;
      }
      uVar2 = 0x53;
    }
    key = (char *)0x0;
  }
  else {
    key = (char *)0x0;
    uVar2 = 0x4b;
  }
LAB_00108471:
  free(key);
  ucvector_cleanup(&decoded);
  return uVar2;
}

Assistant:

static unsigned readChunk_zTXt(LodePNGInfo* info, const LodePNGDecompressSettings* zlibsettings,
                               const unsigned char* data, size_t chunkLength) {
  unsigned error = 0;
  unsigned i;

  unsigned length, string2_begin;
  char *key = 0;
  ucvector decoded;

  ucvector_init(&decoded);

  while(!error) /*not really a while loop, only used to break on error*/ {
    for(length = 0; length < chunkLength && data[length] != 0; ++length) ;
    if(length + 2 >= chunkLength) CERROR_BREAK(error, 75); /*no null termination, corrupt?*/
    if(length < 1 || length > 79) CERROR_BREAK(error, 89); /*keyword too short or long*/

    key = (char*)lodepng_malloc(length + 1);
    if(!key) CERROR_BREAK(error, 83); /*alloc fail*/

    key[length] = 0;
    for(i = 0; i != length; ++i) key[i] = (char)data[i];

    if(data[length + 1] != 0) CERROR_BREAK(error, 72); /*the 0 byte indicating compression must be 0*/

    string2_begin = length + 2;
    if(string2_begin > chunkLength) CERROR_BREAK(error, 75); /*no null termination, corrupt?*/

    length = (unsigned)chunkLength - string2_begin;
    /*will fail if zlib error, e.g. if length is too small*/
    error = zlib_decompress(&decoded.data, &decoded.size,
                            (unsigned char*)(&data[string2_begin]),
                            length, zlibsettings);
    if(error) break;
    ucvector_push_back(&decoded, 0);

    error = lodepng_add_text(info, key, (char*)decoded.data);

    break;
  }

  lodepng_free(key);
  ucvector_cleanup(&decoded);

  return error;
}